

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form2_Flip(FlipForm2 Flip)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t width;
  uint uVar4;
  uint height;
  uint uVar5;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  ImageTemplate<unsigned_char> local_58;
  
  Unit_Test::intensityArray(&local_70,2);
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&local_88,&local_70,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar2 = rand();
  uVar3 = rand();
  uVar5 = (local_88.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_width;
  uVar4 = (local_88.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_height;
  if ((uVar3 & 1) == 0) {
    if (1 < uVar4) {
      height = uVar4 >> 1;
      width = uVar5;
LAB_0014f7e7:
      Image_Function::Fill
                (local_88.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0,0,width,height,value);
    }
  }
  else if (1 < uVar5 && (uVar2 & 1) == 0) {
    width = uVar5 >> 1;
    height = uVar4;
    goto LAB_0014f7e7;
  }
  (*Flip)(local_88.
          super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start,
          local_88.
          super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 1,(uVar2 & 1) == 0,(uVar3 & 1) == 0);
  if ((uVar3 & 1) == 0) {
    bVar1 = Unit_Test::verifyImage
                      (local_88.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,0,0,
                       local_88.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._width,
                       (local_88.
                        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._height >> 1) + (uVar4 & 1),
                       *local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      if (1 < (local_88.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_height) {
        uVar5 = local_88.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._height >> 1;
        bVar1 = Unit_Test::verifyImage
                          (local_88.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1,0,(uVar4 & 1) + uVar5,
                           local_88.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._width,uVar5,value);
LAB_0014f8c6:
        if (bVar1 == false) goto LAB_0014f8ce;
      }
LAB_0014f8ca:
      bVar1 = true;
      goto LAB_0014f8d0;
    }
  }
  else {
    bVar1 = Unit_Test::verifyImage
                      (local_88.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,0,0,
                       (local_88.
                        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._width >> 1) + (uVar5 & 1),
                       local_88.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._height,
                       *local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      if (1 < (local_88.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_width) {
        uVar4 = local_88.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._width >> 1;
        if ((uVar2 & 1) != 0) {
          value = *local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        bVar1 = Unit_Test::verifyImage
                          (local_88.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1,(uVar5 & 1) + uVar4,0,uVar4
                           ,local_88.
                            super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._height,value);
        goto LAB_0014f8c6;
      }
      goto LAB_0014f8ca;
    }
  }
LAB_0014f8ce:
  bVar1 = false;
LAB_0014f8d0:
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_88);
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form2_Flip(FlipForm2 Flip)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const uint8_t intensityFill = intensityValue();
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const bool horizontalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const bool verticalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const uint32_t xCorrection = input[0].width() % 2;
        const uint32_t yCorrection = input[0].height() % 2;

        if (verticalFlip)
        {
            if (input[0].height() > 1)
                Image_Function::Fill(input[0], 0, 0, input[0].width(), input[0].height() / 2, intensityFill);
        }
        else if (horizontalFlip)
        {
            if (input[0].width() > 1)
                Image_Function::Fill(input[0], 0, 0, input[0].width() / 2, input[0].height(), intensityFill);
        }

        Flip( input[0], input[1], horizontalFlip, verticalFlip );

        if (verticalFlip) {
            if( !verifyImage( input[1], 0, 0, input[1].width(), input[1].height() / 2 + yCorrection, intensity[0] ) )
                return false;
            if((input[0].height() > 1) && !verifyImage( input[1], 0, input[1].height() / 2 + yCorrection, input[1].width(), input[1].height() / 2, intensityFill ) )
                return false;
        }
        else {
            if( !verifyImage( input[1], 0, 0, input[1].width() / 2 + xCorrection, input[1].height(), intensity[0] ) )
                return false;
            if((input[0].width() > 1) && !verifyImage( input[1], input[1].width() / 2 + xCorrection, 0, input[1].width() / 2, input[1].height(),
                                                       horizontalFlip ? intensityFill : intensity[0] ) )
                return false;
        }

        return true;
    }